

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepTiledBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_146311::readFile
               (int channelCount,bool bulkRead,bool relativeCoords,bool randomChannels,
               string *filename)

{
  float fVar1;
  PixelType PVar2;
  size_t __n;
  bool bVar3;
  ulong __n_00;
  PixelType PVar4;
  Array2D<void_*> *pAVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  float *pfVar12;
  float *pfVar13;
  undefined4 *puVar14;
  int *piVar15;
  ChannelList *this;
  ChannelList *pCVar16;
  int *piVar17;
  void *pvVar18;
  void *pvVar19;
  ostream *poVar20;
  long lVar21;
  void *pvVar22;
  long *plVar23;
  undefined4 uVar24;
  undefined7 in_register_00000009;
  char *pcVar25;
  long lVar26;
  int i;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  char *pcVar34;
  long lVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  int k;
  long lVar39;
  ulong uVar40;
  long lVar41;
  int j;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  int iVar48;
  int iVar49;
  long local_378;
  ulong local_370;
  long local_368;
  ulong local_360;
  long local_358;
  Array<Imf_3_4::Array2D<void_*>_> data;
  long local_330;
  int local_30c;
  DeepTiledInputFile file;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2e8;
  _Base_ptr local_2d8;
  int local_2bc;
  string str;
  Box2i box;
  vector<int,_std::allocator<int>_> read_channel;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  int local_1b4;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  uVar24 = (undefined4)CONCAT71(in_register_00000009,randomChannels);
  if (bulkRead && relativeCoords) {
    __assert_fail("bulkRead == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1b6,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  __n_00 = (ulong)(uint)channelCount;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
  std::ostream::flush();
  Imf_3_4::DeepTiledInputFile::DeepTiledInputFile(&file,(filename->_M_dataplus)._M_p,4);
  Imf_3_4::DeepTiledInputFile::header();
  puVar10 = (undefined8 *)Imf_3_4::Header::displayWindow();
  puVar11 = (undefined8 *)Imf_3_4::Header::displayWindow();
  iVar47 = -(uint)((int)*puVar11 == (int)*puVar10);
  iVar48 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
  auVar43._4_4_ = iVar47;
  auVar43._0_4_ = iVar47;
  auVar43._8_4_ = iVar48;
  auVar43._12_4_ = iVar48;
  iVar47 = movmskpd(uVar24,auVar43);
  if ((iVar47 != 3) ||
     (iVar48 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
     iVar49 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
     auVar44._4_4_ = iVar48, auVar44._0_4_ = iVar48, auVar44._8_4_ = iVar49, auVar44._12_4_ = iVar49
     , iVar48 = movmskpd((int)puVar11,auVar44), iVar48 != 3)) {
    __assert_fail("fileHeader.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1bd,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  puVar10 = (undefined8 *)Imf_3_4::Header::dataWindow();
  puVar11 = (undefined8 *)Imf_3_4::Header::dataWindow();
  iVar48 = -(uint)((int)*puVar11 == (int)*puVar10);
  iVar49 = -(uint)((int)((ulong)*puVar11 >> 0x20) == (int)((ulong)*puVar10 >> 0x20));
  auVar45._4_4_ = iVar48;
  auVar45._0_4_ = iVar48;
  auVar45._8_4_ = iVar49;
  auVar45._12_4_ = iVar49;
  iVar47 = movmskpd(iVar47,auVar45);
  if ((iVar47 != 3) ||
     (iVar47 = -(uint)((int)puVar11[1] == (int)puVar10[1]),
     iVar48 = -(uint)((int)((ulong)puVar11[1] >> 0x20) == (int)((ulong)puVar10[1] >> 0x20)),
     auVar46._4_4_ = iVar47, auVar46._0_4_ = iVar47, auVar46._8_4_ = iVar48, auVar46._12_4_ = iVar48
     , iVar47 = movmskpd((int)puVar11,auVar46), iVar47 != 3)) {
    __assert_fail("fileHeader.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1be,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar12 = (float *)Imf_3_4::Header::pixelAspectRatio();
  local_370._0_4_ = *pfVar12;
  pfVar12 = (float *)Imf_3_4::Header::pixelAspectRatio();
  if (((float)local_370 != *pfVar12) || (NAN((float)local_370) || NAN(*pfVar12))) {
    __assert_fail("fileHeader.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1bf,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pfVar12 = (float *)Imf_3_4::Header::screenWindowCenter();
  pfVar13 = (float *)Imf_3_4::Header::screenWindowCenter();
  if ((((*pfVar12 != *pfVar13) || (NAN(*pfVar12) || NAN(*pfVar13))) || (pfVar12[1] != pfVar13[1]))
     || (NAN(pfVar12[1]) || NAN(pfVar13[1]))) {
    __assert_fail("fileHeader.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c0,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  puVar14 = (undefined4 *)Imf_3_4::Header::screenWindowWidth();
  local_370 = CONCAT44(local_370._4_4_,*puVar14);
  pfVar12 = (float *)Imf_3_4::Header::screenWindowWidth();
  if (((float)local_370 != *pfVar12) || (NAN((float)local_370) || NAN(*pfVar12))) {
    __assert_fail("fileHeader.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c1,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  piVar15 = (int *)Imf_3_4::Header::lineOrder();
  iVar47 = *piVar15;
  piVar15 = (int *)Imf_3_4::Header::lineOrder();
  if (iVar47 != *piVar15) {
    __assert_fail("fileHeader.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c2,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  piVar15 = (int *)Imf_3_4::Header::compression();
  iVar47 = *piVar15;
  piVar15 = (int *)Imf_3_4::Header::compression();
  if (iVar47 != *piVar15) {
    __assert_fail("fileHeader.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c3,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  this = (ChannelList *)Imf_3_4::Header::channels();
  pCVar16 = (ChannelList *)Imf_3_4::Header::channels();
  cVar6 = Imf_3_4::ChannelList::operator==(this,pCVar16);
  if (cVar6 == '\0') {
    __assert_fail("fileHeader.channels () == header.channels ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c4,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  puVar10 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  puVar11 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  __n = puVar10[1];
  if ((__n != puVar11[1]) ||
     ((__n != 0 && (iVar47 = bcmp((void *)*puVar10,(void *)*puVar11,__n), iVar47 != 0)))) {
    __assert_fail("fileHeader.type () == header.type ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c5,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  piVar15 = (int *)Imf_3_4::Header::tileDescription();
  piVar17 = (int *)Imf_3_4::Header::tileDescription();
  if ((((*piVar15 != *piVar17) || (piVar15[1] != piVar17[1])) || (piVar15[2] != piVar17[2])) ||
     (piVar15[3] != piVar17[3])) {
    __assert_fail("fileHeader.tileDescription () == header.tileDescription ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                  ,0x1c6,
                  "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                 );
  }
  pvVar18 = operator_new__(0x2d0e4);
  uVar7 = random_int(3);
  uVar28 = uVar7 + channelCount;
  Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array(&data,(long)(int)uVar28);
  if (0 < (int)uVar28) {
    lVar39 = 0;
    do {
      pAVar5 = data._data;
      pvVar19 = operator_new__(0x5a1c8);
      pvVar22 = *(void **)((long)&pAVar5->_data + lVar39);
      if (pvVar22 != (void *)0x0) {
        operator_delete__(pvVar22);
      }
      *(undefined8 *)((long)&pAVar5->_sizeX + lVar39) = 0xa9;
      *(undefined8 *)((long)&pAVar5->_sizeY + lVar39) = 0x111;
      *(void **)((long)&pAVar5->_data + lVar39) = pvVar19;
      lVar39 = lVar39 + 0x18;
    } while ((ulong)uVar28 * 0x18 != lVar39);
  }
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  if (relativeCoords) {
    lVar39 = 0;
  }
  else {
    lVar39 = (long)DAT_001e96d4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
  }
  Imf_3_4::Slice::Slice
            ((Slice *)&ss,UINT,(char *)((long)pvVar18 + lVar39 * -4),4,0x444,1,1,0.0,relativeCoords,
             relativeCoords);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  std::vector<int,_std::allocator<int>_>::vector(&read_channel,__n_00,(allocator_type *)&ss);
  if (0 < channelCount) {
    uVar40 = 0;
    lVar29 = 0x10;
    local_370 = lVar39 * -8;
    iVar47 = 0;
    do {
      if (randomChannels) {
        iVar48 = random_int(2);
        read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar40] = iVar48;
        if (!randomChannels || iVar48 == 1) goto LAB_00156ded;
      }
      else {
LAB_00156ded:
        PVar2 = *(PixelType *)((anonymous_namespace)::channelTypes + uVar40 * 4);
        PVar4 = (uint)(PVar2 != UINT) * 3;
        if (PVar2 == HALF) {
          PVar4 = PVar2;
        }
        if (PVar2 == FLOAT) {
          PVar4 = PVar2;
        }
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::operator<<(local_1a8,(int)uVar40);
        std::__cxx11::stringbuf::str();
        iVar48 = *(int *)((anonymous_namespace)::channelTypes + uVar40 * 4);
        uVar38 = (ulong)(iVar48 == 0) << 2;
        if (iVar48 == 1) {
          uVar38 = 2;
        }
        if (iVar48 == 2) {
          uVar38 = 4;
        }
        Imf_3_4::DeepSlice::DeepSlice
                  ((DeepSlice *)&box,PVar4,
                   (char *)(*(long *)((long)&(data._data)->_sizeX + lVar29) + local_370),8,0x888,
                   uVar38,1,1,0.0,relativeCoords,relativeCoords);
        Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        iVar47 = iVar47 + 1;
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
      uVar40 = uVar40 + 1;
      lVar29 = lVar29 + 0x18;
    } while (__n_00 != uVar40);
    if (iVar47 != 0) {
      if (0 < (int)uVar7) {
        lVar39 = __n_00 * 0x18;
        uVar40 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar20 = (ostream *)std::ostream::operator<<(local_1a8,(int)uVar40);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"fill",4);
          std::__cxx11::stringbuf::str();
          Imf_3_4::DeepSlice::DeepSlice
                    ((DeepSlice *)&box,FLOAT,
                     (char *)(*(long *)((long)&(data._data)->_data + lVar39) + local_370),8,0x888,4,
                     1,1,0.0,relativeCoords,relativeCoords);
          Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          std::ios_base::~ios_base(local_138);
          uVar40 = uVar40 + 1;
          lVar39 = lVar39 + 0x18;
        } while (uVar7 != uVar40);
      }
      Imf_3_4::DeepTiledInputFile::setFrameBuffer((DeepFrameBuffer *)&file);
      pcVar25 = "per-tile ";
      if (relativeCoords) {
        pcVar25 = "per-tile with relative coordinates ";
      }
      lVar39 = 9;
      if (relativeCoords) {
        lVar39 = 0x23;
      }
      pcVar34 = "bulk ";
      if (!bulkRead) {
        pcVar34 = pcVar25;
      }
      lVar29 = 5;
      if (!bulkRead) {
        lVar29 = lVar39;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar34,lVar29);
      std::ostream::flush();
      lVar39 = (ulong)uVar7 * 0x18;
      local_378 = 0;
      while (iVar47 = Imf_3_4::DeepTiledInputFile::numYLevels(), local_378 < iVar47) {
        local_368 = 0;
        while( true ) {
          iVar47 = Imf_3_4::DeepTiledInputFile::numXLevels();
          if (iVar47 <= local_368) break;
          Imf_3_4::DeepTiledInputFile::dataWindowForLevel((int)&ss,(int)&file);
          if (bulkRead) {
            iVar47 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file);
            iVar48 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&file);
            Imf_3_4::DeepTiledInputFile::readPixelSampleCounts
                      ((int)&file,0,iVar47 + -1,0,iVar48 + -1,(int)local_368);
            for (iVar47 = 0; iVar48 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&local_378 + 0x88)
                , iVar47 < iVar48; iVar47 = iVar47 + 1) {
              for (iVar48 = 0; iVar49 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file),
                  iVar48 < iVar49; iVar48 = iVar48 + 1) {
                Imf_3_4::DeepTiledInputFile::dataWindowForTile((int)&box,(int)&file,iVar48,iVar47);
                iVar9 = box.max.x;
                iVar49 = box.min.x;
                local_360 = (ulong)box.min.y;
                if (box.min.y <= box.max.y) {
                  lVar29 = (long)box.min.x;
                  local_358 = (long)_ss;
                  lVar26 = DAT_001e9710 * local_378;
                  iVar8 = box.max.x + 1;
                  iVar33 = box.max.y + 1;
                  do {
                    if (iVar49 <= iVar9) {
                      lVar41 = local_360 - (long)local_1b4;
                      lVar35 = lVar29;
                      do {
                        lVar30 = lVar35 - local_358;
                        uVar28 = *(uint *)((long)pvVar18 + lVar30 * 4 + lVar41 * 0x444);
                        uVar40 = (ulong)uVar28;
                        lVar21 = lVar26 * 0x18 + DAT_001e9718;
                        if (uVar28 != *(uint *)(*(long *)(lVar21 + 8 + local_368 * 0x18) * lVar41 *
                                                4 + *(long *)(lVar21 + 0x10 + local_368 * 0x18) +
                                               lVar30 * 4)) {
                          __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x253,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_001e96f8 != (anonymous_namespace)::channelTypes) {
                          local_370 = uVar40 * 2;
                          lVar21 = 4;
                          uVar38 = 0;
                          do {
                            if (*(int *)((anonymous_namespace)::channelTypes + uVar38 * 4) == 0) {
                              pvVar22 = operator_new__(uVar40 * 4);
                              *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) * lVar41 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar21 * 4) +
                                        lVar30 * 8) = pvVar22;
                            }
                            if (*(int *)((anonymous_namespace)::channelTypes + uVar38 * 4) == 1) {
                              pvVar22 = operator_new__(local_370);
                              *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) * lVar41 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar21 * 4) +
                                        lVar30 * 8) = pvVar22;
                            }
                            if (*(int *)((anonymous_namespace)::channelTypes + uVar38 * 4) == 2) {
                              pvVar22 = operator_new__(uVar40 * 4);
                              *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) * lVar41 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar21 * 4) +
                                        lVar30 * 8) = pvVar22;
                            }
                            uVar38 = uVar38 + 1;
                            lVar21 = lVar21 + 6;
                          } while (uVar38 < (ulong)(DAT_001e96f8 -
                                                    (anonymous_namespace)::channelTypes >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar21 = 0;
                          do {
                            pvVar22 = operator_new__(uVar40 << 2);
                            uVar38 = (ulong)(DAT_001e96f8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar38]._sizeY + lVar21) * lVar41
                                       * 8 + *(long *)((long)&data._data[uVar38]._data + lVar21) +
                                      lVar30 * 8) = pvVar22;
                            lVar21 = lVar21 + 0x18;
                          } while (lVar39 != lVar21);
                        }
                        lVar35 = lVar35 + 1;
                      } while (iVar8 != (int)lVar35);
                    }
                    local_360 = local_360 + 1;
                  } while (iVar33 != (int)local_360);
                }
              }
            }
            iVar47 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file);
            iVar48 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&file);
            Imf_3_4::DeepTiledInputFile::readTiles
                      ((int)&file,0,iVar47 + -1,0,iVar48 + -1,(int)local_368);
          }
          else if (relativeCoords) {
            for (local_30c = 0; iVar47 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&file),
                local_30c < iVar47; local_30c = local_30c + 1) {
              for (local_2bc = 0; iVar47 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file),
                  local_2bc < iVar47; local_2bc = local_2bc + 1) {
                Imf_3_4::DeepTiledInputFile::readPixelSampleCount
                          ((int)&file,local_2bc,local_30c,(int)local_368);
                Imf_3_4::DeepTiledInputFile::dataWindowForTile
                          ((int)&box,(int)&file,local_2bc,local_30c);
                iVar48 = box.max.x;
                iVar47 = box.min.x;
                lVar29 = (long)box.min.y;
                if (box.min.y <= box.max.y) {
                  lVar26 = (long)box.min.x;
                  lVar35 = (long)_ss;
                  local_360 = DAT_001e9710 * local_378;
                  iVar9 = box.max.x + 1;
                  iVar49 = box.max.y + 1;
                  local_330 = lVar29;
                  do {
                    if (iVar47 <= iVar48) {
                      local_358 = local_330 - local_1b4;
                      lVar21 = local_330 - lVar29;
                      lVar41 = lVar26;
                      do {
                        lVar31 = lVar41 - lVar26;
                        uVar28 = *(uint *)((long)pvVar18 + lVar31 * 4 + lVar21 * 0x444);
                        uVar40 = (ulong)uVar28;
                        lVar30 = local_360 * 0x18 + DAT_001e9718;
                        if (uVar28 != *(uint *)(*(long *)(lVar30 + 8 + local_368 * 0x18) * local_358
                                                * 4 + *(long *)(lVar30 + 0x10 + local_368 * 0x18) +
                                               (lVar41 - lVar35) * 4)) {
                          __assert_fail("localSampleCount[ty][tx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x2be,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_001e96f8 != (anonymous_namespace)::channelTypes) {
                          local_370 = uVar40 * 2;
                          lVar30 = 4;
                          uVar38 = 0;
                          do {
                            if ((!randomChannels) ||
                               (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar38] == 1)) {
                              if (*(int *)((anonymous_namespace)::channelTypes + uVar38 * 4) == 0) {
                                pvVar22 = operator_new__(uVar40 * 4);
                                *(void **)(*(long *)((long)data._data + lVar30 * 4 + -8) * lVar21 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar30 * 4) +
                                          lVar31 * 8) = pvVar22;
                              }
                              if (*(int *)((anonymous_namespace)::channelTypes + uVar38 * 4) == 1) {
                                pvVar22 = operator_new__(local_370);
                                *(void **)(*(long *)((long)data._data + lVar30 * 4 + -8) * lVar21 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar30 * 4) +
                                          lVar31 * 8) = pvVar22;
                              }
                              if (*(int *)((anonymous_namespace)::channelTypes + uVar38 * 4) == 2) {
                                pvVar22 = operator_new__(uVar40 * 4);
                                *(void **)(*(long *)((long)data._data + lVar30 * 4 + -8) * lVar21 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar30 * 4) +
                                          lVar31 * 8) = pvVar22;
                              }
                            }
                            uVar38 = uVar38 + 1;
                            lVar30 = lVar30 + 6;
                          } while (uVar38 < (ulong)(DAT_001e96f8 -
                                                    (anonymous_namespace)::channelTypes >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar30 = 0;
                          do {
                            pvVar22 = operator_new__(uVar40 << 2);
                            uVar38 = (ulong)(DAT_001e96f8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar38]._sizeY + lVar30) * lVar21
                                       * 8 + *(long *)((long)&data._data[uVar38]._data + lVar30) +
                                      lVar31 * 8) = pvVar22;
                            lVar30 = lVar30 + 0x18;
                          } while (lVar39 != lVar30);
                        }
                        lVar41 = lVar41 + 1;
                      } while (iVar9 != (int)lVar41);
                    }
                    local_330 = local_330 + 1;
                  } while (iVar49 != (int)local_330);
                }
                Imf_3_4::DeepTiledInputFile::readTile((int)&file,local_2bc,local_30c,(int)local_368)
                ;
                iVar47 = box.min.y;
                if (box.min.y <= box.max.y) {
                  do {
                    iVar48 = box.min.x;
                    if (box.min.x <= box.max.x) {
                      do {
                        local_360 = (long)iVar47 - (long)box.min.y;
                        local_358 = (long)iVar48 - (long)box.min.x;
                        if (DAT_001e96f8 != (anonymous_namespace)::channelTypes) {
                          iVar49 = iVar47 - local_1b4;
                          iVar9 = iVar48 - _ss;
                          lVar29 = local_360 * 0x444;
                          iVar33 = (iVar49 * 0x111 + iVar9) % 0x801;
                          local_370 = CONCAT44(local_370._4_4_,(float)iVar33);
                          uVar40 = 0;
                          do {
                            if ((!randomChannels) ||
                               (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar40] == 1)) {
                              lVar26 = (long)*(int *)((long)pvVar18 + local_358 * 4 + lVar29);
                              if (0 < lVar26) {
                                pvVar22 = data._data[uVar40]._data
                                          [data._data[uVar40]._sizeY * local_360 + local_358];
                                iVar8 = *(int *)((anonymous_namespace)::channelTypes + uVar40 * 4);
                                lVar35 = 0;
                                do {
                                  if (iVar8 == 2) {
                                    fVar42 = *(float *)((long)pvVar22 + lVar35 * 4);
                                    if ((fVar42 != (float)local_370) ||
                                       (NAN(fVar42) || NAN((float)local_370))) {
                                      poVar20 = (ostream *)
                                                std::ostream::operator<<(&std::cout,iVar9);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20,", ",2);
                                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar49);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20," error, should be ",0x12);
                                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar33);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20,", is ",5);
                                      poVar20 = std::ostream::_M_insert<double>
                                                          ((double)*(float *)((long)pvVar22 +
                                                                             lVar35 * 4));
                                      std::ios::widen((char)*(undefined8 *)
                                                             (*(long *)poVar20 + -0x18) +
                                                      (char)poVar20);
                                      std::ostream::put((char)poVar20);
                                      std::ostream::flush();
                                      std::ostream::flush();
                                    }
                                    fVar42 = *(float *)((long)pvVar22 + lVar35 * 4);
                                    if ((fVar42 != (float)local_370) ||
                                       (NAN(fVar42) || NAN((float)local_370))) {
                                      __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                                  ,0x1a9,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  else if (iVar8 == 1) {
                                    fVar42 = *(float *)(_imath_half_to_float_table +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar22 + lVar35 * 2) * 4);
                                    if ((fVar42 != (float)local_370) ||
                                       (NAN(fVar42) || NAN((float)local_370))) {
                                      poVar20 = (ostream *)
                                                std::ostream::operator<<(&std::cout,iVar9);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20,", ",2);
                                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar49);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20," error, should be ",0x12);
                                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar33);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20,", is ",5);
                                      plVar23 = (long *)::operator<<(poVar20,(half)*(uint16_t *)
                                                                                    ((long)pvVar22 +
                                                                                    lVar35 * 2));
                                      std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) +
                                                      (char)plVar23);
                                      std::ostream::put((char)plVar23);
                                      std::ostream::flush();
                                      std::ostream::flush();
                                    }
                                    fVar42 = *(float *)(_imath_half_to_float_table +
                                                       (ulong)*(ushort *)
                                                               ((long)pvVar22 + lVar35 * 2) * 4);
                                    if ((fVar42 != (float)local_370) ||
                                       (NAN(fVar42) || NAN((float)local_370))) {
                                      __assert_fail("value[l] == (dwy * width + dwx) % 2049",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                                  ,0x19f,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  else if (iVar8 == 0) {
                                    if (*(int *)((long)pvVar22 + lVar35 * 4) != iVar33) {
                                      poVar20 = (ostream *)
                                                std::ostream::operator<<(&std::cout,iVar9);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20,", ",2);
                                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar49);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20," error, should be ",0x12);
                                      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar33);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar20,", is ",5);
                                      poVar20 = std::ostream::_M_insert<unsigned_long>
                                                          ((ulong)poVar20);
                                      std::ios::widen((char)*(undefined8 *)
                                                             (*(long *)poVar20 + -0x18) +
                                                      (char)poVar20);
                                      std::ostream::put((char)poVar20);
                                      std::ostream::flush();
                                      std::ostream::flush();
                                    }
                                    if (*(int *)((long)pvVar22 + lVar35 * 4) != iVar33) {
                                      __assert_fail(
                                                  "value[l] == static_cast<unsigned int> ((dwy * width + dwx) % 2049)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                                  ,0x195,
                                                  "void (anonymous namespace)::checkValue(void *, int, int, int, int)"
                                                  );
                                    }
                                  }
                                  lVar35 = lVar35 + 1;
                                } while (lVar26 != lVar35);
                              }
                              if ((*(int *)((anonymous_namespace)::channelTypes + uVar40 * 4) == 0)
                                 && (data._data[uVar40]._data
                                     [data._data[uVar40]._sizeY * local_360 + local_358] !=
                                     (void *)0x0)) {
                                operator_delete__(data._data[uVar40]._data
                                                  [data._data[uVar40]._sizeY * local_360 + local_358
                                                  ]);
                              }
                              if ((*(int *)((anonymous_namespace)::channelTypes + uVar40 * 4) == 1)
                                 && (data._data[uVar40]._data
                                     [data._data[uVar40]._sizeY * local_360 + local_358] !=
                                     (void *)0x0)) {
                                operator_delete__(data._data[uVar40]._data
                                                  [data._data[uVar40]._sizeY * local_360 + local_358
                                                  ]);
                              }
                              if ((*(int *)((anonymous_namespace)::channelTypes + uVar40 * 4) == 2)
                                 && (data._data[uVar40]._data
                                     [data._data[uVar40]._sizeY * local_360 + local_358] !=
                                     (void *)0x0)) {
                                operator_delete__(data._data[uVar40]._data
                                                  [data._data[uVar40]._sizeY * local_360 + local_358
                                                  ]);
                              }
                            }
                            uVar40 = uVar40 + 1;
                          } while (uVar40 < (ulong)(DAT_001e96f8 -
                                                    (anonymous_namespace)::channelTypes >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar29 = (long)(int)local_360;
                          lVar26 = (long)(int)(float)local_358;
                          lVar35 = 0;
                          do {
                            uVar40 = (ulong)(DAT_001e96f8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            pvVar22 = *(void **)(*(long *)((long)&data._data[uVar40]._sizeY + lVar35
                                                          ) * lVar29 * 8 +
                                                 *(long *)((long)&data._data[uVar40]._data + lVar35)
                                                + lVar26 * 8);
                            if (pvVar22 != (void *)0x0) {
                              operator_delete__(pvVar22);
                            }
                            lVar35 = lVar35 + 0x18;
                          } while (lVar39 != lVar35);
                        }
                        bVar3 = iVar48 < box.max.x;
                        iVar48 = iVar48 + 1;
                      } while (bVar3);
                    }
                    bVar3 = iVar47 < box.max.y;
                    iVar47 = iVar47 + 1;
                  } while (bVar3);
                }
              }
            }
          }
          else {
            for (iVar47 = 0; iVar48 = Imf_3_4::DeepTiledInputFile::numYTiles((int)&file),
                iVar47 < iVar48; iVar47 = iVar47 + 1) {
              for (iVar48 = 0; iVar49 = Imf_3_4::DeepTiledInputFile::numXTiles((int)&file),
                  iVar48 < iVar49; iVar48 = iVar48 + 1) {
                Imf_3_4::DeepTiledInputFile::readPixelSampleCount
                          ((int)&file,iVar48,iVar47,(int)local_368);
                Imf_3_4::DeepTiledInputFile::dataWindowForTile((int)&box,(int)&file,iVar48,iVar47);
                iVar9 = box.max.x;
                iVar49 = box.min.x;
                local_360 = (ulong)box.min.y;
                if (box.min.y <= box.max.y) {
                  lVar29 = (long)box.min.x;
                  local_358 = (long)_ss;
                  lVar26 = DAT_001e9710 * local_378;
                  iVar8 = box.max.x + 1;
                  iVar33 = box.max.y + 1;
                  do {
                    if (iVar49 <= iVar9) {
                      lVar41 = local_360 - (long)local_1b4;
                      lVar35 = lVar29;
                      do {
                        lVar30 = lVar35 - local_358;
                        uVar28 = *(uint *)((long)pvVar18 + lVar30 * 4 + lVar41 * 0x444);
                        uVar40 = (ulong)uVar28;
                        lVar21 = lVar26 * 0x18 + DAT_001e9718;
                        if (uVar28 != *(uint *)(*(long *)(lVar21 + 8 + local_368 * 0x18) * lVar41 *
                                                4 + *(long *)(lVar21 + 0x10 + local_368 * 0x18) +
                                               lVar30 * 4)) {
                          __assert_fail("localSampleCount[dwy][dwx] == sampleCountWhole[ly][lx][dwy][dwx]"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x28c,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                        if (DAT_001e96f8 != (anonymous_namespace)::channelTypes) {
                          local_370 = uVar40 * 2;
                          lVar21 = 4;
                          uVar38 = 0;
                          do {
                            if (*(int *)((anonymous_namespace)::channelTypes + uVar38 * 4) == 0) {
                              pvVar22 = operator_new__(uVar40 * 4);
                              *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) * lVar41 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar21 * 4) +
                                        lVar30 * 8) = pvVar22;
                            }
                            if (*(int *)((anonymous_namespace)::channelTypes + uVar38 * 4) == 1) {
                              pvVar22 = operator_new__(local_370);
                              *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) * lVar41 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar21 * 4) +
                                        lVar30 * 8) = pvVar22;
                            }
                            if (*(int *)((anonymous_namespace)::channelTypes + uVar38 * 4) == 2) {
                              pvVar22 = operator_new__(uVar40 * 4);
                              *(void **)(*(long *)((long)data._data + lVar21 * 4 + -8) * lVar41 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar21 * 4) +
                                        lVar30 * 8) = pvVar22;
                            }
                            uVar38 = uVar38 + 1;
                            lVar21 = lVar21 + 6;
                          } while (uVar38 < (ulong)(DAT_001e96f8 -
                                                    (anonymous_namespace)::channelTypes >> 2));
                        }
                        if (0 < (int)uVar7) {
                          lVar21 = 0;
                          do {
                            pvVar22 = operator_new__(uVar40 << 2);
                            uVar38 = (ulong)(DAT_001e96f8 - (anonymous_namespace)::channelTypes) >>
                                     2;
                            *(void **)(*(long *)((long)&data._data[uVar38]._sizeY + lVar21) * lVar41
                                       * 8 + *(long *)((long)&data._data[uVar38]._data + lVar21) +
                                      lVar30 * 8) = pvVar22;
                            lVar21 = lVar21 + 0x18;
                          } while (lVar39 != lVar21);
                        }
                        lVar35 = lVar35 + 1;
                      } while (iVar8 != (int)lVar35);
                    }
                    local_360 = local_360 + 1;
                  } while (iVar33 != (int)local_360);
                }
                Imf_3_4::DeepTiledInputFile::readTile((int)&file,iVar48,iVar47,(int)local_368);
              }
            }
          }
          if (!relativeCoords) {
            uVar40 = 0;
            while (iVar47 = Imf_3_4::DeepTiledInputFile::levelHeight((int)&file),
                  (long)uVar40 < (long)iVar47) {
              iVar47 = (int)uVar40 * 0x111;
              uVar38 = uVar40;
              local_370 = uVar40;
              for (lVar29 = 0; iVar48 = Imf_3_4::DeepTiledInputFile::levelWidth((int)&file),
                  lVar29 < iVar48; lVar29 = lVar29 + 1) {
                iVar48 = (int)lVar29;
                uVar37 = (uint)(iVar48 + iVar47) % 0x801;
                fVar42 = (float)uVar37;
                uVar36 = (uint)(iVar48 + iVar47) % 0x801;
                uVar28 = (uint)(iVar47 + iVar48) % 0x801;
                local_360 = (ulong)uVar28;
                local_358 = CONCAT44(local_358._4_4_,(float)uVar28);
                uVar27 = 0;
                do {
                  if (((!randomChannels) ||
                      (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar27] == 1)) &&
                     (*(int *)((long)pvVar18 + lVar29 * 4 + uVar40 * 0x444) != 0)) {
                    uVar32 = 0;
                    do {
                      if (*(int *)((anonymous_namespace)::channelTypes + uVar27 * 4) == 0) {
                        pvVar22 = data._data[uVar27]._data
                                  [data._data[uVar27]._sizeY * uVar38 + lVar29];
                        if (*(uint *)((long)pvVar22 + uVar32 * 4) != uVar36) {
                          poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar48);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
                          poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)uVar38);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar20," error, should be ",0x12);
                          poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar36);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", is ",5);
                          poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
                          std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) +
                                          (char)poVar20);
                          std::ostream::put((char)poVar20);
                          std::ostream::flush();
                          std::ostream::flush();
                        }
                        if (*(uint *)((long)pvVar22 + uVar32 * 4) != uVar36) {
                          __assert_fail("value[l] == static_cast<unsigned int> ( i * width + j) % 2049"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x324,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                      }
                      if (*(int *)((anonymous_namespace)::channelTypes + uVar27 * 4) == 1) {
                        pvVar22 = data._data[uVar27]._data
                                  [data._data[uVar27]._sizeY * uVar38 + lVar29];
                        fVar1 = *(float *)(_imath_half_to_float_table +
                                          (ulong)*(ushort *)((long)pvVar22 + uVar32 * 2) * 4);
                        if ((fVar1 != fVar42) || (NAN(fVar1) || NAN(fVar42))) {
                          poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar48);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
                          poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_370);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar20," error, should be ",0x12);
                          poVar20 = (ostream *)std::ostream::operator<<(poVar20,uVar37);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", is ",5);
                          plVar23 = (long *)::operator<<(poVar20,(half)*(uint16_t *)
                                                                        ((long)pvVar22 + uVar32 * 2)
                                                        );
                          std::ios::widen((char)*(undefined8 *)(*plVar23 + -0x18) + (char)plVar23);
                          std::ostream::put((char)plVar23);
                          std::ostream::flush();
                          std::ostream::flush();
                        }
                        fVar1 = *(float *)(_imath_half_to_float_table +
                                          (ulong)*(ushort *)
                                                  ((long)data._data[uVar27]._data
                                                         [data._data[uVar27]._sizeY * local_370 +
                                                          lVar29] + uVar32 * 2) * 4);
                        if ((fVar1 != fVar42) || (uVar38 = local_370, NAN(fVar1) || NAN(fVar42))) {
                          __assert_fail("((half*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x331,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                      }
                      if (*(int *)((anonymous_namespace)::channelTypes + uVar27 * 4) == 2) {
                        pvVar22 = data._data[uVar27]._data
                                  [data._data[uVar27]._sizeY * uVar38 + lVar29];
                        fVar1 = *(float *)((long)pvVar22 + uVar32 * 4);
                        if ((fVar1 != (float)local_358) || (NAN(fVar1) || NAN((float)local_358))) {
                          poVar20 = (ostream *)std::ostream::operator<<(&std::cout,iVar48);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
                          poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_370);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar20," error, should be ",0x12);
                          poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_360);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", is ",5);
                          poVar20 = std::ostream::_M_insert<double>
                                              ((double)*(float *)((long)pvVar22 + uVar32 * 4));
                          std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) +
                                          (char)poVar20);
                          std::ostream::put((char)poVar20);
                          std::ostream::flush();
                          std::ostream::flush();
                        }
                        fVar1 = *(float *)((long)data._data[uVar27]._data
                                                 [data._data[uVar27]._sizeY * local_370 + lVar29] +
                                          uVar32 * 4);
                        if ((fVar1 != (float)local_358) ||
                           (uVar38 = local_370, NAN(fVar1) || NAN((float)local_358))) {
                          __assert_fail("((float*) (data[k][i][j]))[l] == (i * width + j) % 2049",
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testDeepTiledBasic.cpp"
                                        ,0x33e,
                                        "void (anonymous namespace)::readFile(int, bool, bool, bool, const std::string &)"
                                       );
                        }
                      }
                      uVar32 = uVar32 + 1;
                    } while (uVar32 < *(uint *)((long)pvVar18 + lVar29 * 4 + uVar40 * 0x444));
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != __n_00);
              }
              uVar40 = uVar38 + 1;
            }
            for (lVar29 = 0; iVar47 = Imf_3_4::DeepTiledInputFile::levelHeight((int)&file),
                lVar29 < iVar47; lVar29 = lVar29 + 1) {
              for (lVar26 = 0; iVar47 = Imf_3_4::DeepTiledInputFile::levelWidth((int)&file),
                  lVar26 < iVar47; lVar26 = lVar26 + 1) {
                lVar35 = 4;
                uVar40 = 0;
                do {
                  if ((*(int *)((anonymous_namespace)::channelTypes + uVar40 * 4) == 0) &&
                     (pvVar22 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar29 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) +
                                          lVar26 * 8), pvVar22 != (void *)0x0)) {
                    operator_delete__(pvVar22);
                  }
                  if ((*(int *)((anonymous_namespace)::channelTypes + uVar40 * 4) == 1) &&
                     (pvVar22 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar29 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) +
                                          lVar26 * 8), pvVar22 != (void *)0x0)) {
                    operator_delete__(pvVar22);
                  }
                  if ((*(int *)((anonymous_namespace)::channelTypes + uVar40 * 4) == 2) &&
                     (pvVar22 = *(void **)(*(long *)((long)data._data + lVar35 * 4 + -8) * lVar29 *
                                           8 + *(long *)((long)&(data._data)->_sizeX + lVar35 * 4) +
                                          lVar26 * 8), pvVar22 != (void *)0x0)) {
                    operator_delete__(pvVar22);
                  }
                  uVar40 = uVar40 + 1;
                  lVar35 = lVar35 + 6;
                } while (__n_00 != uVar40);
                if (0 < (int)uVar7) {
                  lVar35 = 0;
                  do {
                    uVar40 = (ulong)(DAT_001e96f8 - (anonymous_namespace)::channelTypes) >> 2;
                    pvVar22 = *(void **)(*(long *)((long)&data._data[uVar40]._sizeY + lVar35) *
                                         lVar29 * 8 +
                                         *(long *)((long)&data._data[uVar40]._data + lVar35) +
                                        lVar26 * 8);
                    if (pvVar22 != (void *)0x0) {
                      operator_delete__(pvVar22);
                    }
                    lVar35 = lVar35 + 0x18;
                  } while (lVar39 != lVar35);
                }
              }
            }
          }
          local_368 = local_368 + 1;
        }
        local_378 = local_378 + 1;
      }
      goto LAB_00158789;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skipping ",9);
  std::ostream::flush();
LAB_00158789:
  if (read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)read_channel.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
               *)&frameBuffer);
  Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array(&data);
  operator_delete__(pvVar18);
  if (local_2d8 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8);
  }
  if (local_2e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2e8);
  }
  return;
}

Assistant:

void
readFile (
    int                channelCount,
    bool               bulkRead,
    bool               relativeCoords,
    bool               randomChannels,
    const std::string& filename)
{
    if (relativeCoords) assert (bulkRead == false);

    cout << "reading " << flush;

    DeepTiledInputFile file (filename.c_str (), 4);

    const Header& fileHeader = file.header ();
    assert (fileHeader.displayWindow () == header.displayWindow ());
    assert (fileHeader.dataWindow () == header.dataWindow ());
    assert (fileHeader.pixelAspectRatio () == header.pixelAspectRatio ());
    assert (fileHeader.screenWindowCenter () == header.screenWindowCenter ());
    assert (fileHeader.screenWindowWidth () == header.screenWindowWidth ());
    assert (fileHeader.lineOrder () == header.lineOrder ());
    assert (fileHeader.compression () == header.compression ());
    assert (fileHeader.channels () == header.channels ());
    assert (fileHeader.type () == header.type ());
    assert (fileHeader.tileDescription () == header.tileDescription ());

    Array2D<unsigned int> localSampleCount;
    localSampleCount.resizeErase (height, width);

    // also test filling channels. Generate up to 2 extra channels
    int fillChannels = random_int (3);

    Array<Array2D<void*>> data (channelCount + fillChannels);
    for (int i = 0; i < channelCount + fillChannels; i++)
        data[i].resizeErase (height, width);

    DeepFrameBuffer frameBuffer;

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;
    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&localSampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    vector<int> read_channel (channelCount);
    int         channels_added = 0;
    for (int i = 0; i < channelCount; i++)
    {
        if (randomChannels) { read_channel[i] = random_int (2); }
        if (!randomChannels || read_channel[i] == 1)
        {
            PixelType type = IMF::NUM_PIXELTYPES;
            if (channelTypes[i] == 0) type = IMF::UINT;
            if (channelTypes[i] == 1) type = IMF::HALF;
            if (channelTypes[i] == 2) type = IMF::FLOAT;

            stringstream ss;
            ss << i;
            string str = ss.str ();

            int sampleSize = 0;
            if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
            if (channelTypes[i] == 1) sampleSize = sizeof (half);
            if (channelTypes[i] == 2) sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                str,
                DeepSlice (
                    type,
                    (char*) (&data[i][0][0] - memOffset),
                    pointerSize * 1,
                    pointerSize * width,
                    sampleSize,
                    1,
                    1,
                    0,
                    relativeCoords,
                    relativeCoords));
            channels_added++;
        }
    }
    if (channels_added == 0)
    {
        cout << "skipping " << flush;
        return;
    }
    for (int i = 0; i < fillChannels; ++i)
    {
        PixelType    type        = IMF::FLOAT;
        int          sampleSize  = sizeof (float);
        int          pointerSize = sizeof (char*);
        stringstream ss;
        // generate channel names that aren't in file but (might) interleave with existing file
        ss << i << "fill";
        string str = ss.str ();
        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i + channelCount][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    if (bulkRead)
        cout << "bulk " << flush;
    else
    {
        if (relativeCoords == false)
            cout << "per-tile " << flush;
        else
            cout << "per-tile with relative coordinates " << flush;
    }

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            if (bulkRead)
            {
                //
                // Testing bulk read (without relative coordinates).
                //

                file.readPixelSampleCounts (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);

                for (int i = 0; i < file.numYTiles (ly); i++)
                {
                    for (int j = 0; j < file.numXTiles (lx); j++)
                    {
                        Box2i box = file.dataWindowForTile (j, i, lx, ly);
                        for (int y = box.min.y; y <= box.max.y; y++)
                            for (int x = box.min.x; x <= box.max.x; x++)
                            {
                                int dwy = y - dataWindowL.min.y;
                                int dwx = x - dataWindowL.min.x;
                                assert (
                                    localSampleCount[dwy][dwx] ==
                                    sampleCountWhole[ly][lx][dwy][dwx]);

                                for (size_t k = 0; k < channelTypes.size ();
                                     k++)
                                {
                                    if (channelTypes[k] == 0)
                                        data[k][dwy][dwx] = new unsigned int
                                            [localSampleCount[dwy][dwx]];
                                    if (channelTypes[k] == 1)
                                        data[k][dwy][dwx] =
                                            new half[localSampleCount[dwy]
                                                                     [dwx]];
                                    if (channelTypes[k] == 2)
                                        data[k][dwy][dwx] =
                                            new float[localSampleCount[dwy]
                                                                      [dwx]];
                                }

                                for (int f = 0; f < fillChannels; ++f)
                                {
                                    data[f + channelTypes.size ()][dwy][dwx] =
                                        new float[localSampleCount[dwy][dwx]];
                                }
                            }
                    }
                }

                file.readTiles (
                    0,
                    file.numXTiles (lx) - 1,
                    0,
                    file.numYTiles (ly) - 1,
                    lx,
                    ly);
            }
            else if (bulkRead == false)
            {
                if (relativeCoords == false)
                {
                    //
                    // Testing per-tile read without relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles (ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles (lx); j++)
                        {
                            file.readPixelSampleCount (j, i, lx, ly);

                            Box2i box = file.dataWindowForTile (j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    assert (
                                        localSampleCount[dwy][dwx] ==
                                        sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (channelTypes[k] == 0)
                                            data[k][dwy][dwx] = new unsigned int
                                                [localSampleCount[dwy][dwx]];
                                        if (channelTypes[k] == 1)
                                            data[k][dwy][dwx] =
                                                new half[localSampleCount[dwy]
                                                                         [dwx]];
                                        if (channelTypes[k] == 2)
                                            data[k][dwy][dwx] = new float
                                                [localSampleCount[dwy][dwx]];
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        data[f + channelTypes.size ()][dwy]
                                            [dwx] = new float
                                                [localSampleCount[dwy][dwx]];
                                    }
                                }

                            file.readTile (j, i, lx, ly);
                        }
                    }
                }
                else if (relativeCoords)
                {
                    //
                    // Testing per-tile read with relative coordinates.
                    //

                    for (int i = 0; i < file.numYTiles (ly); i++)
                    {
                        for (int j = 0; j < file.numXTiles (lx); j++)
                        {
                            file.readPixelSampleCount (j, i, lx, ly);

                            Box2i box = file.dataWindowForTile (j, i, lx, ly);
                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty  = y - box.min.y;
                                    int tx  = x - box.min.x;
                                    assert (
                                        localSampleCount[ty][tx] ==
                                        sampleCountWhole[ly][lx][dwy][dwx]);

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (!randomChannels ||
                                            read_channel[k] == 1)
                                        {
                                            if (channelTypes[k] == 0)
                                                data[k][ty][tx] =
                                                    new unsigned int
                                                        [localSampleCount[ty]
                                                                         [tx]];
                                            if (channelTypes[k] == 1)
                                                data[k][ty][tx] = new half
                                                    [localSampleCount[ty][tx]];
                                            if (channelTypes[k] == 2)
                                                data[k][ty][tx] = new float
                                                    [localSampleCount[ty][tx]];
                                        }
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        data[f + channelTypes.size ()][ty][tx] =
                                            new float[localSampleCount[ty][tx]];
                                    }
                                }

                            file.readTile (j, i, lx, ly);

                            for (int y = box.min.y; y <= box.max.y; y++)
                                for (int x = box.min.x; x <= box.max.x; x++)
                                {
                                    int dwy = y - dataWindowL.min.y;
                                    int dwx = x - dataWindowL.min.x;
                                    int ty  = y - box.min.y;
                                    int tx  = x - box.min.x;

                                    for (size_t k = 0; k < channelTypes.size ();
                                         k++)
                                    {
                                        if (!randomChannels ||
                                            read_channel[k] == 1)
                                        {
                                            checkValue (
                                                data[k][ty][tx],
                                                localSampleCount[ty][tx],
                                                channelTypes[k],
                                                dwx,
                                                dwy);
                                            if (channelTypes[k] == 0)
                                                delete[] (unsigned int*)
                                                    data[k][ty][tx];
                                            if (channelTypes[k] == 1)
                                                delete[] (
                                                    half*) data[k][ty][tx];
                                            if (channelTypes[k] == 2)
                                                delete[] (
                                                    float*) data[k][ty][tx];
                                        }
                                    }
                                    for (int f = 0; f < fillChannels; ++f)
                                    {
                                        delete[] (float*)
                                            data[f + channelTypes.size ()][ty]
                                                [tx];
                                    }
                                }
                        }
                    }
                }
            }

            if (relativeCoords == false)
            {
                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (!randomChannels || read_channel[k] == 1)
                            {
                                for (unsigned int l = 0;
                                     l < localSampleCount[i][j];
                                     l++)
                                {
                                    if (channelTypes[k] == 0)
                                    {
                                        unsigned int* value =
                                            (unsigned int*) (data[k][i][j]);
                                        if (value[l] !=
                                            static_cast<unsigned int> (
                                                i * width + j) %
                                                2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            value[l] ==
                                            static_cast<unsigned int> (
                                                i * width + j) %
                                                2049);
                                    }
                                    if (channelTypes[k] == 1)
                                    {
                                        half* value = (half*) (data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            ((half*) (data[k][i][j]))[l] ==
                                            (i * width + j) % 2049);
                                    }
                                    if (channelTypes[k] == 2)
                                    {
                                        float* value = (float*) (data[k][i][j]);
                                        if (value[l] != (i * width + j) % 2049)
                                            cout << j << ", " << i
                                                 << " error, should be "
                                                 << (i * width + j) % 2049
                                                 << ", is " << value[l] << endl
                                                 << flush;
                                        assert (
                                            ((float*) (data[k][i][j]))[l] ==
                                            (i * width + j) % 2049);
                                    }
                                }
                            }
                        }

                for (int i = 0; i < file.levelHeight (ly); i++)
                    for (int j = 0; j < file.levelWidth (lx); j++)
                    {
                        for (int k = 0; k < channelCount; k++)
                        {
                            if (channelTypes[k] == 0)
                                delete[] (unsigned int*) data[k][i][j];
                            if (channelTypes[k] == 1)
                                delete[] (half*) data[k][i][j];
                            if (channelTypes[k] == 2)
                                delete[] (float*) data[k][i][j];
                        }
                        for (int f = 0; f < fillChannels; ++f)
                        {
                            delete[] (
                                float*) data[f + channelTypes.size ()][i][j];
                        }
                    }
            }
        }
}